

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile.c
# Opt level: O3

LY_ERR lys_compile(lys_module *mod,lys_depset_unres *unres)

{
  void **ppvVar1;
  lysp_submodule *plVar2;
  ly_ctx *ctx;
  lysc_ext_instance *plVar3;
  lysp_ext_instance *plVar4;
  lysp_include *plVar5;
  lysp_submodule *plVar6;
  LY_ERR LVar7;
  lysc_module *module;
  long *plVar8;
  lysp_ext_instance *plVar9;
  lysp_ext_instance *plVar10;
  lysp_node_grp *plVar11;
  ulong uVar12;
  char *pcVar13;
  undefined8 uVar14;
  long lVar15;
  lysp_node_action *plVar16;
  lysp_node_notif *plVar17;
  long lVar18;
  lysp_node *plVar19;
  ulong uVar20;
  void *pvVar21;
  ulong local_10e0;
  lysc_ctx local_10d0;
  
  memset(&local_10d0,0,0x10a0);
  if (mod == (lys_module *)0x0) {
    pcVar13 = "mod";
LAB_0014112c:
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",pcVar13,"lys_compile");
    return LY_EINVAL;
  }
  plVar2 = (lysp_submodule *)mod->parsed;
  if (plVar2 == (lysp_submodule *)0x0) {
    pcVar13 = "mod->parsed";
    goto LAB_0014112c;
  }
  if (mod->compiled != (lysc_module *)0x0) {
    pcVar13 = "!mod->compiled";
    goto LAB_0014112c;
  }
  ctx = mod->ctx;
  if (ctx == (ly_ctx *)0x0) {
    pcVar13 = "mod->ctx";
    goto LAB_0014112c;
  }
  if ((mod->implemented == '\0') || (mod->to_compile == '\0')) {
    __assert_fail("mod->implemented && mod->to_compile",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile.c"
                  ,0x6b2,"LY_ERR lys_compile(struct lys_module *, struct lys_depset_unres *)");
  }
  local_10d0.cur_mod = plVar2->mod;
  local_10d0.ctx = (local_10d0.cur_mod)->ctx;
  local_10d0.path_len = 1;
  local_10d0.path[0] = '/';
  local_10d0.free_ctx.ctx = plVar2->mod->ctx;
  ctx->change_count = ctx->change_count + 1;
  local_10d0.pmod = (lysp_module *)plVar2;
  local_10d0.unres = unres;
  module = (lysc_module *)calloc(1,0x28);
  mod->compiled = module;
  if (module == (lysc_module *)0x0) {
    ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_compile");
    return LY_EMEM;
  }
  module->mod = mod;
  LVar7 = lys_precompile_own_augments(&local_10d0);
  if ((LVar7 == LY_SUCCESS) &&
     (LVar7 = lys_precompile_own_deviations(&local_10d0), LVar7 == LY_SUCCESS)) {
    plVar19 = plVar2->data;
    if (plVar19 != (lysp_node *)0x0) {
      do {
        LVar7 = lys_compile_node(&local_10d0,plVar19,(lysc_node *)0x0,0,(ly_set *)0x0);
        if (LVar7 != LY_SUCCESS) goto LAB_00141208;
        plVar19 = plVar19->next;
      } while (plVar19 != (lysp_node *)0x0);
    }
    plVar16 = plVar2->rpcs;
    if (plVar16 != (lysp_node_action *)0x0) {
      do {
        LVar7 = lys_compile_node(&local_10d0,(lysp_node *)plVar16,(lysc_node *)0x0,0,(ly_set *)0x0);
        if (LVar7 != LY_SUCCESS) goto LAB_00141208;
        plVar16 = (lysp_node_action *)(plVar16->field_0).node.next;
      } while (plVar16 != (lysp_node_action *)0x0);
    }
    plVar17 = plVar2->notifs;
    if (plVar17 != (lysp_node_notif *)0x0) {
      do {
        LVar7 = lys_compile_node(&local_10d0,(lysp_node *)plVar17,(lysc_node *)0x0,0,(ly_set *)0x0);
        if (LVar7 != LY_SUCCESS) goto LAB_00141208;
        plVar17 = (lysp_node_notif *)(plVar17->field_0).node.next;
      } while (plVar17 != (lysp_node_notif *)0x0);
    }
    plVar9 = plVar2->exts;
    if (plVar9 == (lysp_ext_instance *)0x0) {
LAB_001415b7:
      uVar20 = 0;
      while( true ) {
        plVar5 = plVar2->includes;
        if (plVar5 == (lysp_include *)0x0) {
          uVar12 = 0;
        }
        else {
          uVar12 = *(ulong *)(plVar5[-1].rev + 8);
        }
        if (uVar12 <= uVar20) break;
        plVar6 = plVar5[uVar20].submodule;
        local_10d0.pmod = (lysp_module *)plVar6;
        for (plVar19 = plVar6->data; plVar19 != (lysp_node *)0x0; plVar19 = plVar19->next) {
          LVar7 = lys_compile_node(&local_10d0,plVar19,(lysc_node *)0x0,0,(ly_set *)0x0);
          if (LVar7 != LY_SUCCESS) goto LAB_00141208;
        }
        for (plVar16 = plVar6->rpcs; plVar16 != (lysp_node_action *)0x0;
            plVar16 = (lysp_node_action *)(plVar16->field_0).node.next) {
          LVar7 = lys_compile_node(&local_10d0,(lysp_node *)plVar16,(lysc_node *)0x0,0,(ly_set *)0x0
                                  );
          if (LVar7 != LY_SUCCESS) goto LAB_00141208;
        }
        for (plVar17 = plVar6->notifs; plVar17 != (lysp_node_notif *)0x0;
            plVar17 = (lysp_node_notif *)(plVar17->field_0).node.next) {
          LVar7 = lys_compile_node(&local_10d0,(lysp_node *)plVar17,(lysc_node *)0x0,0,(ly_set *)0x0
                                  );
          if (LVar7 != LY_SUCCESS) goto LAB_00141208;
        }
        plVar9 = plVar6->exts;
        if (plVar9 != (lysp_ext_instance *)0x0) {
          plVar3 = module->exts;
          if (plVar3 == (lysc_ext_instance *)0x0) {
            plVar8 = (long *)calloc(1,(long)plVar9[-1].exts * 0x48 + 8);
            if (plVar8 == (long *)0x0) goto LAB_0014179d;
            lVar18 = 0;
            pvVar21 = (void *)0x0;
          }
          else {
            pvVar21 = plVar3[-1].compiled;
            plVar8 = (long *)realloc(&plVar3[-1].compiled,
                                     ((long)&(plVar9[-1].exts)->name + (long)pvVar21 * 2) * 0x48 + 8
                                    );
            if (plVar8 == (long *)0x0) goto LAB_0014179d;
            lVar18 = *plVar8;
          }
          module->exts = (lysc_ext_instance *)(plVar8 + 1);
          if (plVar6->exts == (lysp_ext_instance *)0x0) {
            plVar9 = (lysp_ext_instance *)0x0;
          }
          else {
            plVar9 = plVar6->exts[-1].exts;
          }
          memset(plVar8 + lVar18 * 9 + 1,0,((long)&plVar9->name + (long)pvVar21) * 0x48);
          lVar18 = 0;
          plVar9 = (lysp_ext_instance *)0x0;
          while( true ) {
            plVar4 = plVar6->exts;
            if (plVar4 == (lysp_ext_instance *)0x0) {
              plVar10 = (lysp_ext_instance *)0x0;
            }
            else {
              plVar10 = plVar4[-1].exts;
            }
            if (plVar10 <= plVar9) break;
            plVar3 = module->exts;
            pvVar21 = plVar3[-1].compiled;
            plVar3[-1].compiled = (void *)((long)pvVar21 + 1);
            LVar7 = lys_compile_ext(&local_10d0,(lysp_ext_instance *)((long)&plVar4->name + lVar18),
                                    plVar3 + (long)pvVar21,module);
            if (LVar7 != LY_SUCCESS) {
              if (LVar7 != LY_ENOT) goto LAB_00141208;
              ppvVar1 = &module->exts[-1].compiled;
              *ppvVar1 = (void *)((long)*ppvVar1 + -1);
            }
            plVar9 = (lysp_ext_instance *)((long)&plVar9->name + 1);
            lVar18 = lVar18 + 0x70;
          }
        }
        uVar20 = uVar20 + 1;
      }
      local_10d0.compile_opts._0_1_ = (byte)local_10d0.compile_opts | 1;
      plVar11 = plVar2->groupings;
      local_10d0.pmod = (lysp_module *)plVar2;
      if (plVar11 != (lysp_node_grp *)0x0) {
        do {
          if (((undefined1  [64])((undefined1  [64])plVar11->field_0 & (undefined1  [64])0x4000000)
               == (undefined1  [64])0x0) &&
             (LVar7 = lys_compile_grouping(&local_10d0,(lysp_node *)0x0,plVar11),
             LVar7 != LY_SUCCESS)) goto LAB_00141208;
          plVar11 = (plVar11->field_0).field_1.next;
        } while (plVar11 != (lysp_node_grp *)0x0);
      }
      for (plVar19 = plVar2->data; plVar19 != (lysp_node *)0x0; plVar19 = plVar19->next) {
        for (plVar11 = lysp_node_groupings(plVar19); plVar11 != (lysp_node_grp *)0x0;
            plVar11 = (plVar11->field_0).field_1.next) {
          if (((undefined1  [64])((undefined1  [64])plVar11->field_0 & (undefined1  [64])0x4000000)
               == (undefined1  [64])0x0) &&
             (LVar7 = lys_compile_grouping(&local_10d0,plVar19,plVar11), LVar7 != LY_SUCCESS))
          goto LAB_00141208;
        }
      }
      local_10e0 = 0;
      while( true ) {
        plVar5 = plVar2->includes;
        if (plVar5 == (lysp_include *)0x0) {
          uVar20 = 0;
        }
        else {
          uVar20 = *(ulong *)(plVar5[-1].rev + 8);
        }
        if (uVar20 <= local_10e0) break;
        plVar6 = plVar5[local_10e0].submodule;
        local_10d0.pmod = (lysp_module *)plVar6;
        for (plVar11 = plVar6->groupings; plVar11 != (lysp_node_grp *)0x0;
            plVar11 = (plVar11->field_0).field_1.next) {
          if (((undefined1  [64])((undefined1  [64])plVar11->field_0 & (undefined1  [64])0x4000000)
               == (undefined1  [64])0x0) &&
             (LVar7 = lys_compile_grouping(&local_10d0,(lysp_node *)0x0,plVar11),
             LVar7 != LY_SUCCESS)) goto LAB_00141208;
        }
        for (plVar19 = plVar6->data; plVar19 != (lysp_node *)0x0; plVar19 = plVar19->next) {
          for (plVar11 = lysp_node_groupings(plVar19); plVar11 != (lysp_node_grp *)0x0;
              plVar11 = (plVar11->field_0).field_1.next) {
            if (((undefined1  [64])
                 ((undefined1  [64])plVar11->field_0 & (undefined1  [64])0x4000000) ==
                 (undefined1  [64])0x0) &&
               (LVar7 = lys_compile_grouping(&local_10d0,plVar19,plVar11), LVar7 != LY_SUCCESS))
            goto LAB_00141208;
          }
        }
        local_10e0 = local_10e0 + 1;
      }
      local_10d0.pmod = (lysp_module *)plVar2;
      ly_log_location_revert(0,0,1,0);
      LVar7 = lys_compile_unres_mod(&local_10d0);
    }
    else {
      plVar3 = module->exts;
      if (plVar3 == (lysc_ext_instance *)0x0) {
        plVar8 = (long *)calloc(1,(long)plVar9[-1].exts * 0x48 + 8);
        if (plVar8 != (long *)0x0) {
          lVar18 = 0;
          pvVar21 = (void *)0x0;
          goto LAB_0014151c;
        }
      }
      else {
        pvVar21 = plVar3[-1].compiled;
        plVar8 = (long *)realloc(&plVar3[-1].compiled,
                                 ((long)&(plVar9[-1].exts)->name + (long)pvVar21 * 2) * 0x48 + 8);
        if (plVar8 != (long *)0x0) {
          lVar18 = *plVar8;
LAB_0014151c:
          module->exts = (lysc_ext_instance *)(plVar8 + 1);
          if (plVar2->exts == (lysp_ext_instance *)0x0) {
            plVar9 = (lysp_ext_instance *)0x0;
          }
          else {
            plVar9 = plVar2->exts[-1].exts;
          }
          lVar15 = 0;
          memset(plVar8 + lVar18 * 9 + 1,0,((long)&plVar9->name + (long)pvVar21) * 0x48);
          plVar9 = (lysp_ext_instance *)0x0;
          while( true ) {
            plVar4 = plVar2->exts;
            if (plVar4 == (lysp_ext_instance *)0x0) {
              plVar10 = (lysp_ext_instance *)0x0;
            }
            else {
              plVar10 = plVar4[-1].exts;
            }
            if (plVar10 <= plVar9) break;
            plVar3 = module->exts;
            pvVar21 = plVar3[-1].compiled;
            plVar3[-1].compiled = (void *)((long)pvVar21 + 1);
            LVar7 = lys_compile_ext(&local_10d0,(lysp_ext_instance *)((long)&plVar4->name + lVar15),
                                    plVar3 + (long)pvVar21,module);
            if (LVar7 != LY_SUCCESS) {
              if (LVar7 != LY_ENOT) goto LAB_00141208;
              ppvVar1 = &module->exts[-1].compiled;
              *ppvVar1 = (void *)((long)*ppvVar1 + -1);
            }
            plVar9 = (lysp_ext_instance *)((long)&plVar9->name + 1);
            lVar15 = lVar15 + 0x70;
          }
          goto LAB_001415b7;
        }
      }
LAB_0014179d:
      LVar7 = LY_EMEM;
      ly_log(local_10d0.ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_compile");
    }
  }
LAB_00141208:
  ly_log_location_revert(0,0,1,0);
  ly_set_erase(&local_10d0.groupings,(_func_void_void_ptr *)0x0);
  ly_set_erase(&local_10d0.tpdf_chain,(_func_void_void_ptr *)0x0);
  if ((char)LVar7 == '\0') {
    if (local_10d0.augs.count == 0) {
      if (local_10d0.devs.count == 0) {
        ly_set_erase(&local_10d0.augs,(_func_void_void_ptr *)0x0);
        ly_set_erase(&local_10d0.devs,(_func_void_void_ptr *)0x0);
        ly_set_erase(&local_10d0.uses_augs,(_func_void_void_ptr *)0x0);
        goto LAB_00141313;
      }
      uVar14 = 0x68a;
    }
    else {
      uVar14 = 0x689;
    }
    ly_log(local_10d0.ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile.c"
           ,uVar14);
  }
  else {
    if (local_10d0.augs.count != 0) {
      uVar20 = 0;
      do {
        lysc_augment_free(local_10d0.ctx,(lysc_augment *)local_10d0.augs.field_2.dnodes[uVar20]);
        uVar20 = uVar20 + 1;
      } while (uVar20 < local_10d0.augs.count);
    }
    ly_set_erase(&local_10d0.augs,(_func_void_void_ptr *)0x0);
    if (local_10d0.devs.count != 0) {
      uVar20 = 0;
      do {
        lysc_deviation_free(local_10d0.ctx,(lysc_deviation *)local_10d0.devs.field_2.dnodes[uVar20])
        ;
        uVar20 = uVar20 + 1;
      } while (uVar20 < local_10d0.devs.count);
    }
    ly_set_erase(&local_10d0.devs,(_func_void_void_ptr *)0x0);
    if (local_10d0.uses_augs.count != 0) {
      uVar20 = 0;
      do {
        lysc_augment_free(local_10d0.ctx,(lysc_augment *)local_10d0.uses_augs.field_2.dnodes[uVar20]
                         );
        uVar20 = uVar20 + 1;
      } while (uVar20 < local_10d0.uses_augs.count);
    }
    ly_set_erase(&local_10d0.uses_augs,(_func_void_void_ptr *)0x0);
    if (local_10d0.uses_rfns.count != 0) {
      uVar20 = 0;
      do {
        lysc_refine_free(local_10d0.ctx,(lysc_refine *)local_10d0.uses_rfns.field_2.dnodes[uVar20]);
        uVar20 = uVar20 + 1;
      } while (uVar20 < local_10d0.uses_rfns.count);
    }
LAB_00141313:
    ly_set_erase(&local_10d0.uses_rfns,(_func_void_void_ptr *)0x0);
  }
  if (LVar7 != LY_SUCCESS) {
    lysc_module_free(&local_10d0.free_ctx,module);
    mod->compiled = (lysc_module *)0x0;
    return LVar7;
  }
  return LY_SUCCESS;
}

Assistant:

LY_ERR
lys_compile(struct lys_module *mod, struct lys_depset_unres *unres)
{
    struct lysc_ctx ctx = {0};
    struct lysc_module *mod_c = NULL;
    struct lysp_module *sp;
    struct lysp_submodule *submod;
    struct lysp_node *pnode;
    struct lysp_node_grp *grp;
    LY_ARRAY_COUNT_TYPE u;
    LY_ERR ret = LY_SUCCESS;

    LY_CHECK_ARG_RET(NULL, mod, mod->parsed, !mod->compiled, mod->ctx, LY_EINVAL);

    assert(mod->implemented && mod->to_compile);

    sp = mod->parsed;
    LYSC_CTX_INIT_PMOD(ctx, sp, NULL);
    ctx.unres = unres;

    ++mod->ctx->change_count;
    mod->compiled = mod_c = calloc(1, sizeof *mod_c);
    LY_CHECK_ERR_RET(!mod_c, LOGMEM(mod->ctx), LY_EMEM);
    mod_c->mod = mod;

    /* compile augments and deviations of our module from other modules so they can be applied during compilation */
    LY_CHECK_GOTO(ret = lys_precompile_own_augments(&ctx), cleanup);
    LY_CHECK_GOTO(ret = lys_precompile_own_deviations(&ctx), cleanup);

    /* data nodes */
    LY_LIST_FOR(sp->data, pnode) {
        LY_CHECK_GOTO(ret = lys_compile_node(&ctx, pnode, NULL, 0, NULL), cleanup);
    }

    /* top-level RPCs */
    LY_LIST_FOR((struct lysp_node *)sp->rpcs, pnode) {
        LY_CHECK_GOTO(ret = lys_compile_node(&ctx, pnode, NULL, 0, NULL), cleanup);
    }

    /* top-level notifications */
    LY_LIST_FOR((struct lysp_node *)sp->notifs, pnode) {
        LY_CHECK_GOTO(ret = lys_compile_node(&ctx, pnode, NULL, 0, NULL), cleanup);
    }

    /* module extension instances */
    COMPILE_EXTS_GOTO(&ctx, sp->exts, mod_c->exts, mod_c, ret, cleanup);

    /* the same for submodules */
    LY_ARRAY_FOR(sp->includes, u) {
        submod = sp->includes[u].submodule;
        ctx.pmod = (struct lysp_module *)submod;

        LY_LIST_FOR(submod->data, pnode) {
            ret = lys_compile_node(&ctx, pnode, NULL, 0, NULL);
            LY_CHECK_GOTO(ret, cleanup);
        }

        LY_LIST_FOR((struct lysp_node *)submod->rpcs, pnode) {
            ret = lys_compile_node(&ctx, pnode, NULL, 0, NULL);
            LY_CHECK_GOTO(ret, cleanup);
        }

        LY_LIST_FOR((struct lysp_node *)submod->notifs, pnode) {
            ret = lys_compile_node(&ctx, pnode, NULL, 0, NULL);
            LY_CHECK_GOTO(ret, cleanup);
        }

        COMPILE_EXTS_GOTO(&ctx, submod->exts, mod_c->exts, mod_c, ret, cleanup);
    }
    ctx.pmod = sp;

    /* validate non-instantiated groupings from the parsed schema,
     * without it we would accept even the schemas with invalid grouping specification */
    ctx.compile_opts |= LYS_COMPILE_GROUPING;
    LY_LIST_FOR(sp->groupings, grp) {
        if (!(grp->flags & LYS_USED_GRP)) {
            LY_CHECK_GOTO(ret = lys_compile_grouping(&ctx, NULL, grp), cleanup);
        }
    }
    LY_LIST_FOR(sp->data, pnode) {
        LY_LIST_FOR((struct lysp_node_grp *)lysp_node_groupings(pnode), grp) {
            if (!(grp->flags & LYS_USED_GRP)) {
                LY_CHECK_GOTO(ret = lys_compile_grouping(&ctx, pnode, grp), cleanup);
            }
        }
    }
    LY_ARRAY_FOR(sp->includes, u) {
        submod = sp->includes[u].submodule;
        ctx.pmod = (struct lysp_module *)submod;

        LY_LIST_FOR(submod->groupings, grp) {
            if (!(grp->flags & LYS_USED_GRP)) {
                LY_CHECK_GOTO(ret = lys_compile_grouping(&ctx, NULL, grp), cleanup);
            }
        }
        LY_LIST_FOR(submod->data, pnode) {
            LY_LIST_FOR((struct lysp_node_grp *)lysp_node_groupings(pnode), grp) {
                if (!(grp->flags & LYS_USED_GRP)) {
                    LY_CHECK_GOTO(ret = lys_compile_grouping(&ctx, pnode, grp), cleanup);
                }
            }
        }
    }
    ctx.pmod = sp;

    ly_log_location_revert(0, 0, 1, 0);

    /* finish compilation for all unresolved module items in the context */
    LY_CHECK_GOTO(ret = lys_compile_unres_mod(&ctx), cleanup);

cleanup:
    ly_log_location_revert(0, 0, 1, 0);
    lys_compile_unres_mod_erase(&ctx, ret);
    if (ret) {
        lysc_module_free(&ctx.free_ctx, mod_c);
        mod->compiled = NULL;
    }
    return ret;
}